

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O1

int XMLSearch_node_matches(XMLNode *node,XMLSearch *search)

{
  XMLAttribute *pXVar1;
  XMLAttribute *pXVar2;
  SXML_CHAR *pSVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  XMLSearch *local_40;
  
  local_40 = search;
  do {
    if (node == (XMLNode *)0x0) {
      return 0;
    }
    if (local_40 == (XMLSearch *)0x0) {
      return 1;
    }
    if ((node->tag_type & ~TAG_PARTIAL) != TAG_FATHER) {
      return 0;
    }
    if ((local_40->tag != (SXML_CHAR *)0x0) &&
       (iVar4 = (*regstrcmp_search)(node->tag,local_40->tag), iVar4 == 0)) {
      return 0;
    }
    if ((local_40->text != (SXML_CHAR *)0x0) &&
       (iVar4 = (*regstrcmp_search)(node->text,local_40->text), iVar4 == 0)) {
      return 0;
    }
    if ((local_40->attributes != (XMLAttribute *)0x0) && (0 < local_40->n_attributes)) {
      lVar7 = 0;
      do {
        lVar5 = 0;
        if (0 < node->n_attributes) {
          lVar6 = 0x10;
          lVar5 = 0;
          do {
            pXVar1 = node->attributes;
            if (*(int *)((long)&pXVar1->name + lVar6) != 0) {
              pXVar2 = local_40->attributes;
              if (pXVar1 == (XMLAttribute *)0x0 && pXVar2 == (XMLAttribute *)0x0) break;
              if ((pXVar1 != (XMLAttribute *)0x0) && (pXVar2 != (XMLAttribute *)0x0)) {
                pXVar2 = pXVar2 + lVar7;
                pSVar3 = pXVar2->name;
                if (((pSVar3 == (SXML_CHAR *)0x0) || (*pSVar3 == '\0')) ||
                   ((iVar4 = (*regstrcmp_search)(*(SXML_CHAR **)((long)pXVar1 + lVar6 + -0x10),
                                                 pSVar3), iVar4 != 0 &&
                    ((pXVar2->value == (SXML_CHAR *)0x0 ||
                     (iVar4 = (*regstrcmp_search)(*(SXML_CHAR **)((long)pXVar1 + lVar6 + -8),
                                                  pXVar2->value), iVar4 == pXVar2->active))))))
                break;
              }
            }
            lVar5 = lVar5 + 1;
            lVar6 = lVar6 + 0x18;
          } while (lVar5 < node->n_attributes);
        }
        if (node->n_attributes <= (int)lVar5) {
          return 0;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < local_40->n_attributes);
    }
    local_40 = local_40->prev;
    if (local_40 == (_XMLSearch *)0x0) {
      return 1;
    }
    node = node->father;
  } while( true );
}

Assistant:

int XMLSearch_node_matches(const XMLNode* node, const XMLSearch* search)
{
	int i, j;

	if (node == NULL)
		return FALSE;

	if (search == NULL)
		return TRUE;

	/* No comments, prolog, or such type of nodes are tested */
	if (node->tag_type != TAG_FATHER && node->tag_type != TAG_SELF)
		return FALSE;

	/* Check tag */
	if (search->tag != NULL && !regstrcmp_search(node->tag, search->tag))
		return FALSE;

	/* Check text */
	if (search->text != NULL && !regstrcmp_search(node->text, search->text))
		return FALSE;

	/* Check attributes */
	if (search->attributes != NULL) {
		for (i = 0; i < search->n_attributes; i++) {
			for (j = 0; j < node->n_attributes; j++) {
				if (!node->attributes[j].active)
					continue;
				if (_attribute_matches(&node->attributes[j], &search->attributes[i]))
					break;
			}
			if (j >= node->n_attributes) /* All attributes where scanned without a successful match */
				return FALSE;
		}
	}

	/* 'node' matches 'search'. If there is a father search, its father must match it */
	if (search->prev != NULL)
		return XMLSearch_node_matches(node->father, search->prev);

	/* TODO: Should a node match if search has no more 'prev' search and node father is still below the initial search ?
	 Depends if XPath started with "//" (=> yes) or "/" (=> no).
	 if (search->prev == NULL && node->father != search->from) return FALSE; ? */
		
	return TRUE;
}